

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set_column.h
# Opt level: O0

void Gudhi::persistence_matrix::swap
               (Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>
                *col1,Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>
                      *col2)

{
  Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>
  *col2_local;
  Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>
  *col1_local;
  
  swap((Dummy_row_access *)col1,(Dummy_row_access *)col2);
  swap(&col1->super_Column_dimension_option,&col2->super_Column_dimension_option);
  swap(&col1->super_Chain_column_option,&col2->super_Chain_column_option);
  std::
  unordered_set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*>_>
  ::swap(&col1->column_,&col2->column_);
  std::swap<Gudhi::persistence_fields::Zp_field_operators<unsigned_int,void>*>
            (&col1->operators_,&col2->operators_);
  std::
  swap<Gudhi::persistence_matrix::New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>*>
            (&col1->entryPool_,&col2->entryPool_);
  return;
}

Assistant:

void swap(Unordered_set_column& col1, Unordered_set_column& col2) {
    swap(static_cast<typename Master_matrix::Row_access_option&>(col1),
         static_cast<typename Master_matrix::Row_access_option&>(col2));
    swap(static_cast<typename Master_matrix::Column_dimension_option&>(col1),
         static_cast<typename Master_matrix::Column_dimension_option&>(col2));
    swap(static_cast<typename Master_matrix::Chain_column_option&>(col1),
         static_cast<typename Master_matrix::Chain_column_option&>(col2));
    col1.column_.swap(col2.column_);
    std::swap(col1.operators_, col2.operators_);
    std::swap(col1.entryPool_, col2.entryPool_);
  }